

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

int voc_lookup_type(voccxdef *ctx,char *p,int len,int of_is_spec)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ushort **ppuVar6;
  vocdef *pvVar7;
  int extraout_EDX;
  uint uVar8;
  long lVar9;
  vocwdef *pvVar10;
  
  cVar1 = *p;
  if (-1 < (long)cVar1) {
    ppuVar6 = __ctype_b_loc();
    if (((*ppuVar6)[cVar1] >> 8 & 1) != 0) {
      return 0x20;
    }
    if (((((*ppuVar6)[cVar1] >> 10 & 1) == 0) && (cVar1 != '-')) && (cVar1 != '\'')) {
      return 0x20;
    }
  }
  uVar3 = vochsh((uchar *)p,len);
  pvVar7 = ctx->voccxhsh[uVar3];
  if (pvVar7 == (vocdef *)0x0) {
    uVar5 = 0;
    len = extraout_EDX;
  }
  else {
    uVar5 = 0;
    do {
      bVar2 = pvVar7->voclen;
      if (bVar2 == 0 && len == 0) {
LAB_001f1fc2:
        uVar8 = pvVar7->vocwlst;
        if ((uVar8 != 0xffffffff) && (ctx->voccxwp[(ulong)uVar8 / 2000] != (vocwdef *)0x0)) {
          pvVar10 = ctx->voccxwp[(ulong)uVar8 / 2000] + uVar8 % 2000;
          do {
            if ((pvVar10->vocwflg & 8) == 0) {
              if ((ulong)pvVar10->vocwtyp == 7) {
                if ((uint)bVar2 == len) {
                  uVar5 = uVar5 | 0x44;
                }
              }
              else {
                uVar5 = uVar5 | voctype[pvVar10->vocwtyp];
              }
            }
            uVar8 = pvVar10->vocwnxt;
          } while ((uVar8 != 0xffffffff) &&
                  (pvVar10 = ctx->voccxwp[(ulong)uVar8 / 2000] + uVar8 % 2000,
                  ctx->voccxwp[(ulong)uVar8 / 2000] != (vocwdef *)0x0));
        }
      }
      else if ((len != 0) && (bVar2 != 0)) {
        uVar8 = len;
        if ((uint)bVar2 < (uint)len) {
          uVar8 = (uint)bVar2;
        }
        if ((uint)len < 6) {
          uVar8 = (uint)bVar2;
        }
        if (uVar8 == len) {
          lVar9 = 0;
          do {
            if (p[lVar9] != pvVar7->voctxt[lVar9]) goto LAB_001f2054;
            lVar9 = lVar9 + 1;
          } while (len != (int)lVar9);
          goto LAB_001f1fc2;
        }
      }
LAB_001f2054:
      pvVar7 = pvVar7->vocnxt;
    } while (pvVar7 != (vocdef *)0x0);
  }
  if ((of_is_spec != 0) && (uVar5 == 0)) {
    iVar4 = voc_check_special(ctx,p,len);
    uVar5 = (uint)(iVar4 != 0) << 5;
  }
  return uVar5;
}

Assistant:

static int voc_lookup_type(voccxdef *ctx, char *p, int len, int of_is_spec)
{
    int t;
    
    /* check for a special word */
    if (vocisspec(p))
    {
        /* it's a special word - this is its type */
        t = VOCT_SPEC;
    }
    else
    {
        vocwdef *vw;
        vocdef  *v;

        /*
         *   Now check the various entries of this word to get the word
         *   type flag bits.  The Noun and Adjective flags can be set for
         *   any word which matches this word in the first six letters (or
         *   more if more were provided by the player), but the Plural
         *   flag can only be set if the plural word matches exactly.
         *   Note that this pass only matches the first word in two-word
         *   verbs; the second word is considered later during the
         *   semantic analysis.  
         */
        for (t = 0, v = ctx->voccxhsh[vochsh((uchar *)p, len)] ; v != 0 ;
             v = v->vocnxt)
        {
            /* if this hash chain entry matches, add it to our types */
            if (voceq((uchar *)p, len, v->voctxt, v->voclen))
            {
                /* we have a match - look through relation list for word */
                for (vw = vocwget(ctx, v->vocwlst) ; vw != 0 ;
                     vw = vocwget(ctx, vw->vocwnxt))
                {
                    /* skip this word if it's been deleted */
                    if (vw->vocwflg & VOCFDEL)
                        continue;

                    /* we need a special check for plurals */
                    if (vw->vocwtyp == PRP_PLURAL)
                    {
                        /* plurals must be exact (non-truncated) match */
                        if (len == v->voclen)
                        {
                            /* plurals also count as nouns */
                            t |= (VOCT_NOUN | VOCT_PLURAL);
                        }
                    }
                    else
                    {
                        /* add this type bit to our type value */
                        t |= voctype[vw->vocwtyp];
                    }
                }
            }
        }
    }

    /* check for "of" if the caller wants us to */
    if (of_is_spec && t == 0 && voc_check_special(ctx, p, VOCW_OF))
        t = VOCT_SPEC;

    /* return the type */
    return t;
}